

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

void __thiscall ConfigTest_rewrite_Test::~ConfigTest_rewrite_Test(ConfigTest_rewrite_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ConfigTest, rewrite) {
	config l_config;

	// Write temp file out
	std::filesystem::path file_path = make_tmp_file("rewrite.test", "some_data");

	// Load data from disk
	l_config.load(file_path);

	// Set some other data
	l_config.set_data(u8"some_other_data");

	// Write data to disk
	l_config.write();

	// Reload from disk and verify
	l_config.reload();
	EXPECT_EQ(l_config.data().get<std::u8string>(), u8"some_other_data");
}